

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phi.cpp
# Opt level: O2

int64_t __thiscall anon_unknown.dwarf_40e13::PhiCache::phi<_1>(PhiCache *this,int64_t x,int64_t a)

{
  uint uVar1;
  pointer piVar2;
  bool bVar3;
  ulong uVar4;
  uint64_t uVar5;
  int64_t iVar6;
  long lVar7;
  int64_t iVar8;
  uint64_t uVar9;
  ulong uVar10;
  int64_t i;
  uint64_t a_00;
  int64_t sum;
  ulong sum_00;
  
  if (x <= (this->primes_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start[a]) {
    return -1;
  }
  if (a < 7) {
    uVar4 = primesum::phi_tiny<long>(x,a);
  }
  else {
    bVar3 = is_pix(this,x,a);
    if (bVar3) {
      uVar4 = primesum::PiTable::operator[](this->pi_,x);
      return ~uVar4 + a;
    }
    bVar3 = is_cached(this,x,a);
    if (!bVar3) {
      uVar5 = primesum::isqrt<long>(x);
      if ((long)uVar5 < 0xd) {
        a_00 = (uint64_t)*(int *)(primesum::PhiTiny::pi + uVar5 * 4);
      }
      else {
        a_00 = 6;
      }
      iVar6 = a;
      if (((long)uVar5 < (long)(this->pi_->max_ + 1)) &&
         (iVar6 = primesum::PiTable::operator[](this->pi_,uVar5), a <= iVar6)) {
        iVar6 = a;
      }
      lVar7 = primesum::phi_tiny<long>(x,a_00);
      sum = a - (lVar7 + iVar6);
      for (; (long)a_00 < iVar6; a_00 = a_00 + 1) {
        piVar2 = (this->primes_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar1 = piVar2[a_00 + 1];
        if (x < 0x100000000) {
          uVar4 = (x & 0xffffffffU) / (ulong)uVar1;
        }
        else {
          uVar4 = x / (long)(int)uVar1;
        }
        bVar3 = is_pix(this,uVar4,a_00);
        if (bVar3) {
          iVar8 = primesum::PiTable::operator[](this->pi_,uVar4);
          sum_00 = (iVar8 - a_00) + 1;
        }
        else {
          sum_00 = 1;
          if ((long)piVar2[a_00] < (long)uVar4) {
            if ((long)a_00 < 7) {
              sum_00 = primesum::phi_tiny<long>(uVar4,a_00);
            }
            else {
              bVar3 = is_cached(this,uVar4,a_00);
              if (bVar3) {
                sum_00 = (ulong)(this->cache_)._M_elems[a_00].
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar4];
              }
              else {
                uVar5 = primesum::isqrt<long>(uVar4);
                iVar8 = 6;
                if ((long)uVar5 < 0xd) {
                  iVar8 = (int64_t)*(int *)(primesum::PhiTiny::pi + uVar5 * 4);
                }
                uVar9 = a_00;
                if (((long)uVar5 < (long)(this->pi_->max_ + 1)) &&
                   (uVar9 = primesum::PiTable::operator[](this->pi_,uVar5), (long)a_00 < (long)uVar9
                   )) {
                  uVar9 = a_00;
                }
                lVar7 = primesum::phi_tiny<long>(uVar4,iVar8);
                sum_00 = lVar7 + (uVar9 - a_00);
                for (; iVar8 < (long)uVar9; iVar8 = iVar8 + 1) {
                  uVar1 = (this->primes_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[iVar8 + 1];
                  if ((long)uVar4 < 0x100000000) {
                    uVar10 = (uVar4 & 0xffffffff) / (ulong)uVar1;
                  }
                  else {
                    uVar10 = (long)uVar4 / (long)(int)uVar1;
                  }
                  bVar3 = is_pix(this,uVar10,iVar8);
                  if (bVar3) {
                    uVar10 = primesum::PiTable::operator[](this->pi_,uVar10);
                    lVar7 = ~uVar10 + iVar8;
                  }
                  else {
                    lVar7 = phi<_1>(this,uVar10,iVar8);
                  }
                  sum_00 = sum_00 + lVar7;
                }
                update_cache(this,uVar4,a_00,sum_00);
              }
            }
          }
        }
        sum = sum + sum_00;
      }
      update_cache(this,x,a,sum);
      return sum;
    }
    uVar4 = (ulong)(this->cache_)._M_elems[a].
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start[x];
  }
  return -uVar4;
}

Assistant:

int64_t phi(int64_t x, int64_t a)
  {
    if (x <= primes_[a])
      return SIGN;
    else if (is_phi_tiny(a))
      return phi_tiny(x, a) * SIGN;
    else if (is_pix(x, a))
      return (pi_[x] - a + 1) * SIGN;
    else if (is_cached(x, a))
      return cache_[a][x] * SIGN;

    int64_t sqrtx = isqrt(x);
    int64_t pi_sqrtx = a;
    int64_t c = PhiTiny::get_c(sqrtx);
    int64_t sum = 0;

    if (sqrtx < pi_.size())
      pi_sqrtx = min(pi_[sqrtx], a);

    // Move out of the loop the calculations where phi(x2, i) = 1
    // phi(x, a) = 1 if primes_[a] >= x
    // x2 = x / primes_[i + 1]
    // phi(x2, i) = 1 if primes_[i] >= x / primes_[i + 1]
    // phi(x2, i) = 1 if primes_[i] >= sqrt(x)
    // phi(x2, i) = 1 if i >= pi(sqrt(x))
    // \sum_{i = pi(sqrt(x))}^{a - 1} phi(x2, i) = a - pi(sqrt(x))
    //
    sum += (pi_sqrtx - a) * SIGN;
    sum += phi_tiny(x, c) * SIGN;

    for (int64_t i = c; i < pi_sqrtx; i++)
    {
      int64_t x2 = fast_div(x, primes_[i + 1]);

      if (is_pix(x2, i))
        sum += (pi_[x2] - i + 1) * -SIGN;
      else
        sum += phi<-SIGN>(x2, i);
    }

    update_cache(x, a, sum);

    return sum;
  }